

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O3

void __thiscall
PatchCredits::inject_all_checks_signature(PatchCredits *this,ROM *rom,RandomizerWorld *world)

{
  ushort *puVar1;
  ushort uVar2;
  unsigned_short uVar3;
  pointer ppIVar4;
  ItemSource *this_00;
  Item *pIVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  pointer ppIVar14;
  pointer puVar15;
  initializer_list<unsigned_short> __l;
  ByteArray all_checks_bytes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> all_checks_signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_98;
  PatchCredits *local_80;
  string local_78;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  uStack_48 = 0xffffffff;
  uStack_44 = 0xff3ff7ffff87ffff;
  uStack_58 = 0xf71f5efe7fb3ffff;
  uStack_50 = 0xfffffcff;
  local_4c = 0xffffffff;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0xfffffeffff3ffeff;
  local_78._M_string_length = 0x300ffff;
  __l._M_len = 0x1e;
  __l._M_array = (iterator)&local_78;
  local_80 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_98,__l,(allocator_type *)&local_b8);
  ppIVar14 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar4 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar14 == ppIVar4) {
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar15 = local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar3 = *puVar15;
          local_78._M_dataplus._M_p._0_1_ = (char)(uVar3 >> 8);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,
                     (uchar *)&local_78);
          local_78._M_dataplus._M_p._0_1_ = (char)uVar3;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,
                     (uchar *)&local_78);
          puVar15 = puVar15 + 1;
        } while (puVar15 !=
                 local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      uVar8 = md::ROM::inject_bytes(rom,&local_b8,&local_78);
      local_80->_all_checks_bytes_addr = uVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this_00 = *ppIVar14;
    bVar6 = ItemSource::is_ground_item(this_00);
    if ((bVar6) || (bVar6 = ItemSource::is_shop_item(this_00), bVar6)) {
      pIVar5 = this_00->_item;
      if (pIVar5 == (Item *)0x0) {
        uVar9 = 0x3f;
      }
      else {
        bVar13 = pIVar5->_id;
        uVar9 = (ulong)bVar13;
        if ((bVar13 == 0x3e) || (bVar13 == 0x7f)) goto LAB_001748c1;
      }
      cVar7 = (char)uVar9;
      uVar2 = (world->_item_quantities)._M_elems[uVar9];
      if (uVar2 == 0) {
        bVar6 = cVar7 == '\x1b' || cVar7 == '/';
      }
      else {
        bVar6 = pIVar5->_max_quantity < uVar2 && pIVar5->_max_quantity < 9;
      }
      if ((cVar7 == '?') || (bVar6)) {
        bVar13 = this_00[1]._name.field_2._M_local_buf[0];
        bVar6 = ItemSource::is_shop_item(this_00);
        uVar11 = (uint)(bVar13 >> 3);
        uVar12 = uVar11 | 0x1060;
        if (bVar6) {
          uVar12 = uVar11 + 0x1064;
        }
        bVar13 = bVar13 & 7;
        bVar10 = bVar13 + 8;
        if ((uVar12 & 1) != 0) {
          bVar10 = bVar13;
        }
        puVar1 = (ushort *)
                 ((long)local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                 (ulong)(uVar12 - 0x1060 & 0xfffffffe));
        *puVar1 = *puVar1 & (-2 << (bVar10 & 0xf) | 0xfffeU >> 0x10 - (bVar10 & 0xf));
      }
    }
LAB_001748c1:
    ppIVar14 = ppIVar14 + 1;
  } while( true );
}

Assistant:

void inject_all_checks_signature(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint16_t> all_checks_signature = {
            0xFEFF, 0xFF3F, 0xFEFF, 0xFFFF, 0xFFFF, 0x0300, 0x0000, 0x0000,
            0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
            0xFFFF, 0x7FB3, 0x5EFE, 0xF71F, 0xFCFF, 0xFFFF, 0xFFFF, 0xFFFF,
            0xFFFF, 0xFFFF, 0xFFFF, 0xFF87, 0xF7FF, 0xFF3F
        };

        // If item has less than 9 max quantity in inventory (because items with 9 max are inherently consumable),
        // and the world contains more than the max carriable amount, there is a "golden ending softlock" potential.
        // For instance, taking a first Garlic in a chest makes all Garlic in shops disappear forever, since it can
        // never be consumed. It's also true with basically any unique item in the game that could be put in big
        // amounts in items distribution and would lead to unachievable golden endings.

        // For this reason, we just remove the need for checks that *might* become unobtainable for those reasons.
        // (Oh and also, empty items on ground cannot be taken. That's just sad.)
        for(ItemSource* item_source : world.item_sources())
        {
            if(!item_source->is_ground_item() && !item_source->is_shop_item())
                continue;
            if(item_source->item_id() == ITEM_LIFESTOCK || item_source->item_id() == ITEM_ARCHIPELAGO) // Lifestock can (almost) always be taken
                continue;

            uint8_t item_id = item_source->item_id();
            uint16_t quantity_in_world = world.item_quantities()[item_id];
            uint8_t max_qty = item_source->item()->max_quantity();
            bool more_than_max_inventory = false;
            if(quantity_in_world == 0)
            {
                // If quantity is 0 but we still encounter that item, it means we are in Archipelago / plando context.
                // In that case, distribution is fixed and we only have to care about two cases: Garlic and Logs.
                more_than_max_inventory = (item_id == ITEM_LOGS || item_id == ITEM_GARLIC);
            }
            else if(max_qty < 9 && quantity_in_world > max_qty)
            {
                more_than_max_inventory = true;
            }

            if(item_id == ITEM_NONE || more_than_max_inventory)
            {
                Flag flag = PatchFlagsForGroundItems::get_checked_flag_for_item_source(reinterpret_cast<ItemSourceOnGround*>(item_source));
                size_t word_index = (flag.byte - (PatchFlagsForGroundItems::GROUND_ITEM_FLAGS_START_ADDR & 0xFFFF)) / 2;

                uint8_t bit_index = flag.bit;
                if(flag.byte % 2 == 0)
                    bit_index += 8;
                uint16_t mask = ~(1 << bit_index);

                all_checks_signature[word_index] &= mask;
            }
        }

        ByteArray all_checks_bytes;
        for(uint16_t word : all_checks_signature)
            all_checks_bytes.add_word(word);
        _all_checks_bytes_addr = rom.inject_bytes(all_checks_bytes);
    }